

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O2

Symbol __thiscall avro::parsing::Symbol::rootSymbol(Symbol *this,ProductionPtr *s)

{
  any extraout_RDX;
  Symbol SVar1;
  shared_count local_38;
  cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>
  local_30;
  
  boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
  local_30.head.px = s->px;
  local_30.head.pn.pi_ = (s->pn).pi_;
  if (local_30.head.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_30.head.pn.pi_)->use_count_ = (local_30.head.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_30.tail.head.pn.pi_ = local_38.pi_;
  if (local_38.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_38.pi_)->use_count_ = (local_38.pi_)->use_count_ + 1;
    UNLOCK();
  }
  Symbol<boost::tuples::tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
            (this,sRoot,
             (tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
              *)&local_30);
  boost::tuples::
  cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>
  ::~cons(&local_30);
  boost::detail::shared_count::~shared_count(&local_38);
  SVar1.extra_.content = extraout_RDX.content;
  SVar1._0_8_ = this;
  return SVar1;
}

Assistant:

static Symbol rootSymbol(ProductionPtr& s)
    {
        return Symbol(Symbol::sRoot, RootInfo(s, boost::make_shared<Production>()));
    }